

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

int __thiscall NTrodeObj::copy(NTrodeObj *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  NTrodeObj *this_00;
  reference pvVar1;
  int i;
  size_type __n;
  
  this_00 = (NTrodeObj *)operator_new(0x48);
  NTrodeObj(this_00);
  std::__cxx11::string::_M_assign((string *)&this_00->id);
  for (__n = 0; (long)__n <
                (long)(int)((ulong)((long)(this->hw_chans).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                   (long)(this->hw_chans).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start) >> 2); __n = __n + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(&this->hw_chans,__n);
    addHWChan(this_00,*pvVar1);
  }
  return (int)this_00;
}

Assistant:

NTrodeObj* NTrodeObj::copy() {
    NTrodeObj* newObj = new NTrodeObj();
    newObj->setId(id);
    for (int i = 0; i < (int)hw_chans.size(); i++) {
        newObj->addHWChan(hw_chans.at(i));
    }
    return(newObj);
}